

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

void __thiscall QTreeWidgetItem::setData(QTreeWidgetItem *this,int column,int role,QVariant *value)

{
  QTreeWidgetItem *pQVar1;
  initializer_list<int> args;
  initializer_list<int> args_00;
  bool bVar2;
  Int IVar3;
  QTreeModel *pQVar4;
  reference this_00;
  const_reference ppQVar5;
  QTreeModel *this_01;
  qsizetype qVar6;
  const_reference pQVar7;
  reference pQVar8;
  reference pQVar9;
  QTreeWidgetItem *in_RCX;
  int in_EDX;
  uint in_ESI;
  QTreeWidgetItem *in_RDI;
  long in_FS_OFFSET;
  QTreeWidgetItem *p;
  int i_2;
  bool found;
  QTreeWidgetItem *child;
  int i_1;
  int i;
  QTreeModel *model;
  QList<int> roles;
  QList<QWidgetItemData> column_values;
  ItemFlags f;
  undefined4 in_stack_fffffffffffffe08;
  ItemFlag in_stack_fffffffffffffe0c;
  uint7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  QTreeWidget *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  QTreeWidgetItem *in_stack_fffffffffffffe28;
  QTreeModel *in_stack_fffffffffffffe30;
  QTreeModel *in_stack_fffffffffffffe38;
  bool local_199;
  QTreeWidgetItem *local_178;
  int local_148;
  int local_134;
  int local_12c;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_104;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  QList<QWidgetItemData> local_e8;
  Int local_cc;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_c8;
  undefined4 local_c0;
  undefined4 local_bc;
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < (int)in_ESI) {
    pQVar4 = treeModel((QTreeWidgetItem *)
                       CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                       in_stack_fffffffffffffe18);
    if ((in_EDX == 0) || (in_EDX == 2)) {
      qVar6 = QList<QList<QWidgetItemData>_>::size(&in_RDI->values);
      if (qVar6 <= (int)in_ESI) {
        if ((pQVar4 == (QTreeModel *)0x0) || (in_RDI != pQVar4->headerItem)) {
          QList<QList<QWidgetItemData>_>::resize
                    ((QList<QList<QWidgetItemData>_> *)
                     CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                     (qsizetype)in_stack_fffffffffffffe18);
        }
        else {
          QTreeModel::setColumnCount
                    (in_stack_fffffffffffffe38,(int)((ulong)in_stack_fffffffffffffe30 >> 0x20));
        }
      }
      qVar6 = QList<QVariant>::size(&in_RDI->d->display);
      if ((int)in_ESI < qVar6) {
        QList<QVariant>::operator[]
                  ((QList<QVariant> *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                   CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        bVar2 = ::operator!=((QVariant *)
                             CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                             (QVariant *)
                             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        if (!bVar2) goto LAB_00915035;
        this_00 = QList<QVariant>::operator[]
                            ((QList<QVariant> *)
                             CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        ::QVariant::operator=(this_00,(QVariant *)in_RCX);
      }
      else {
        qVar6 = QList<QVariant>::size(&in_RDI->d->display);
        for (local_12c = (int)qVar6 + -1; local_12c < (int)(in_ESI - 1); local_12c = local_12c + 1)
        {
          ::QVariant::QVariant((QVariant *)0x91491d);
          QList<QVariant>::append
                    ((QList<QVariant> *)
                     CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                     (rvalue_ref)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
          ::QVariant::~QVariant(&local_28);
        }
        QList<QVariant>::append
                  ((QList<QVariant> *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                   (parameter_type)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      }
    }
    else {
      if (in_EDX == 10) {
        local_c8.super_QFlagsStorage<Qt::ItemFlag>.i =
             (QFlagsStorage<Qt::ItemFlag>)
             QFlags<Qt::ItemFlag>::operator&
                       ((QFlags<Qt::ItemFlag> *)
                        CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                        in_stack_fffffffffffffe0c);
        IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c8);
        local_199 = false;
        if (IVar3 != 0) {
          ::QVariant::QVariant(&local_48,1);
          local_199 = ::operator!=((QVariant *)
                                   CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                                   (QVariant *)
                                   CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
          ::QVariant::~QVariant(&local_48);
        }
        if (local_199 != false) {
          for (local_134 = 0; qVar6 = QList<QTreeWidgetItem_*>::size(&in_RDI->children),
              local_134 < qVar6; local_134 = local_134 + 1) {
            ppQVar5 = QList<QTreeWidgetItem_*>::at
                                ((QList<QTreeWidgetItem_*> *)
                                 CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                                 CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
            pQVar1 = *ppQVar5;
            (*pQVar1->_vptr_QTreeWidgetItem[3])(&local_68,pQVar1,(ulong)in_ESI,10);
            bVar2 = ::QVariant::isValid((QVariant *)
                                        CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10
                                                ));
            ::QVariant::~QVariant(&local_68);
            if (bVar2) {
              local_cc = (in_RDI->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
                         super_QFlagsStorage<Qt::ItemFlag>.i;
              QFlags<Qt::ItemFlag>::operator&=(&in_RDI->itemFlags,-0x41);
              (*pQVar1->_vptr_QTreeWidgetItem[4])(pQVar1,(ulong)in_ESI,10,in_RCX);
              (in_RDI->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
              super_QFlagsStorage<Qt::ItemFlag>.i = local_cc;
            }
          }
        }
      }
      this_01 = (QTreeModel *)(long)(int)in_ESI;
      qVar6 = QList<QList<QWidgetItemData>_>::size(&in_RDI->values);
      if ((long)this_01 < qVar6) {
        bVar2 = false;
        local_e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_e8.d.ptr = (QWidgetItemData *)&DAT_aaaaaaaaaaaaaaaa;
        local_e8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        QList<QList<QWidgetItemData>_>::at
                  ((QList<QList<QWidgetItemData>_> *)
                   CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                   CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        QList<QWidgetItemData>::QList
                  ((QList<QWidgetItemData> *)
                   CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                   (QList<QWidgetItemData> *)
                   CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        local_148 = 0;
        while( true ) {
          in_stack_fffffffffffffe30 = (QTreeModel *)(long)local_148;
          qVar6 = QList<QWidgetItemData>::size(&local_e8);
          if (qVar6 <= (long)in_stack_fffffffffffffe30) break;
          pQVar7 = QList<QWidgetItemData>::at
                             ((QList<QWidgetItemData> *)
                              CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                              CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
          if (pQVar7->role == in_EDX) {
            QList<QWidgetItemData>::at
                      ((QList<QWidgetItemData> *)
                       CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                       CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
            bVar2 = ::operator==((QVariant *)
                                 CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                                 (QVariant *)
                                 CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
            if (bVar2) {
              bVar2 = true;
              goto LAB_00914d92;
            }
            QList<QList<QWidgetItemData>_>::operator[]
                      ((QList<QList<QWidgetItemData>_> *)
                       CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                       CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
            pQVar8 = QList<QWidgetItemData>::operator[]
                               ((QList<QWidgetItemData> *)
                                CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                                CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
            ::QVariant::operator=(&pQVar8->value,(QVariant *)in_RCX);
            bVar2 = true;
            in_stack_fffffffffffffe28 = in_RCX;
            break;
          }
          local_148 = local_148 + 1;
        }
        if (!bVar2) {
          pQVar9 = QList<QList<QWidgetItemData>_>::operator[]
                             ((QList<QList<QWidgetItemData>_> *)
                              CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                              CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
          in_stack_fffffffffffffe20 = SUB84(pQVar9,0);
          in_stack_fffffffffffffe24 = (int)((ulong)pQVar9 >> 0x20);
          QWidgetItemData::QWidgetItemData
                    ((QWidgetItemData *)
                     CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                     in_stack_fffffffffffffe0c,(QVariant *)0x914d68);
          QList<QWidgetItemData>::append
                    ((QList<QWidgetItemData> *)
                     CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                     (rvalue_ref)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
          QWidgetItemData::~QWidgetItemData((QWidgetItemData *)0x914d87);
        }
        bVar2 = false;
LAB_00914d92:
        QList<QWidgetItemData>::~QList((QList<QWidgetItemData> *)0x914d9f);
        if (bVar2) goto LAB_00915035;
      }
      else {
        if ((pQVar4 == (QTreeModel *)0x0) || (in_RDI != pQVar4->headerItem)) {
          QList<QList<QWidgetItemData>_>::resize
                    ((QList<QList<QWidgetItemData>_> *)
                     CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                     (qsizetype)in_stack_fffffffffffffe18);
        }
        else {
          QTreeModel::setColumnCount(this_01,(int)((ulong)in_stack_fffffffffffffe30 >> 0x20));
        }
        in_stack_fffffffffffffe18 =
             (QTreeWidget *)
             QList<QList<QWidgetItemData>_>::operator[]
                       ((QList<QList<QWidgetItemData>_> *)
                        CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                        CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        QWidgetItemData::QWidgetItemData
                  ((QWidgetItemData *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                   in_stack_fffffffffffffe0c,(QVariant *)0x914e3f);
        QList<QWidgetItemData>::append
                  ((QList<QWidgetItemData> *)
                   CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                   (rvalue_ref)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        QWidgetItemData::~QWidgetItemData((QWidgetItemData *)0x914e5e);
      }
    }
    if (pQVar4 != (QTreeModel *)0x0) {
      local_100 = &DAT_aaaaaaaaaaaaaaaa;
      local_f8 = &DAT_aaaaaaaaaaaaaaaa;
      local_f0 = &DAT_aaaaaaaaaaaaaaaa;
      if ((in_EDX == 0) || (in_EDX == 2)) {
        local_c0 = 0;
        local_bc = 2;
        args._M_array._4_4_ = in_stack_fffffffffffffe24;
        args._M_array._0_4_ = in_stack_fffffffffffffe20;
        args._M_len = (size_type)in_stack_fffffffffffffe28;
        QList<int>::QList((QList<int> *)in_stack_fffffffffffffe18,args);
      }
      else {
        args_00._M_array._4_4_ = in_stack_fffffffffffffe24;
        args_00._M_array._0_4_ = in_stack_fffffffffffffe20;
        args_00._M_len = (size_type)in_stack_fffffffffffffe28;
        QList<int>::QList((QList<int> *)in_stack_fffffffffffffe18,args_00);
      }
      QTreeModel::emitDataChanged
                (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                 (QList<int> *)in_stack_fffffffffffffe18);
      if (in_EDX == 10) {
        local_178 = in_RDI->par;
        while( true ) {
          bVar2 = false;
          if (local_178 != (QTreeWidgetItem *)0x0) {
            local_104.super_QFlagsStorage<Qt::ItemFlag>.i =
                 (QFlagsStorage<Qt::ItemFlag>)
                 QFlags<Qt::ItemFlag>::operator&
                           ((QFlags<Qt::ItemFlag> *)(ulong)in_stack_fffffffffffffe10,
                            in_stack_fffffffffffffe0c);
            IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_104);
            bVar2 = IVar3 != 0;
          }
          if (!bVar2) break;
          QTreeModel::emitDataChanged
                    (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                     (QList<int> *)in_stack_fffffffffffffe18);
          local_178 = local_178->par;
        }
      }
      QList<int>::~QList((QList<int> *)0x915035);
    }
  }
LAB_00915035:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeWidgetItem::setData(int column, int role, const QVariant &value)
{
    if (column < 0)
        return;

    QTreeModel *model = treeModel();
    switch (role) {
    case Qt::EditRole:
    case Qt::DisplayRole: {
        if (values.size() <= column) {
            if (model && this == model->headerItem)
                model->setColumnCount(column + 1);
            else
                values.resize(column + 1);
        }
        if (d->display.size() <= column) {
            for (int i = d->display.size() - 1; i < column - 1; ++i)
                d->display.append(QVariant());
            d->display.append(value);
        } else if (d->display[column] != value) {
            d->display[column] = value;
        } else {
            return; // value is unchanged
        }
    } break;
    case Qt::CheckStateRole:
        if ((itemFlags & Qt::ItemIsAutoTristate) && value != Qt::PartiallyChecked) {
            for (int i = 0; i < children.size(); ++i) {
                QTreeWidgetItem *child = children.at(i);
                if (child->data(column, role).isValid()) {// has a CheckState
                    Qt::ItemFlags f = itemFlags; // a little hack to avoid multiple dataChanged signals
                    itemFlags &= ~Qt::ItemIsAutoTristate;
                    child->setData(column, role, value);
                    itemFlags = f;
                }
            }
        }
        Q_FALLTHROUGH();
    default:
        if (column < values.size()) {
            bool found = false;
            const QList<QWidgetItemData> column_values = values.at(column);
            for (int i = 0; i < column_values.size(); ++i) {
                if (column_values.at(i).role == role) {
                    if (column_values.at(i).value == value)
                        return; // value is unchanged
                    values[column][i].value = value;
                    found = true;
                    break;
                }
            }
            if (!found)
                values[column].append(QWidgetItemData(role, value));
        } else {
            if (model && this == model->headerItem)
                model->setColumnCount(column + 1);
            else
                values.resize(column + 1);
            values[column].append(QWidgetItemData(role, value));
        }
    }

    if (model) {
        const QList<int> roles((role == Qt::DisplayRole || role == Qt::EditRole)
                                       ? QList<int>({ Qt::DisplayRole, Qt::EditRole })
                                       : QList<int>({ role }));
        model->emitDataChanged(this, column, roles);
        if (role == Qt::CheckStateRole) {
            QTreeWidgetItem *p;
            for (p = par; p && (p->itemFlags & Qt::ItemIsAutoTristate); p = p->par)
                model->emitDataChanged(p, column, roles);
        }
    }
}